

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZNLMultGridAnalysis.cpp
# Opt level: O2

void __thiscall
TPZNonLinMultGridAnalysis::TPZNonLinMultGridAnalysis
          (TPZNonLinMultGridAnalysis *this,TPZCompMesh *cmesh)

{
  TPZSolver *pTVar1;
  TPZMatrixSolver<double> *object;
  TPZFMatrix<double> *this_00;
  TPZFMatrix<double> *A;
  allocator<char> local_141;
  TPZAutoPointer<TPZMatrix<double>_> local_140;
  TPZStack<TPZFMatrix<double>_*,_10> *local_138;
  TPZStepSolver<double> solver;
  
  TPZLinearAnalysis::TPZLinearAnalysis
            (&this->super_TPZLinearAnalysis,&PTR_PTR_017a05d8,cmesh,true,(ostream *)&std::cout);
  (this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZNonLinMultGridAnalysis_017a04c8;
  TPZStack<TPZCompMesh_*,_10>::TPZStack(&this->fMeshes);
  local_138 = &this->fSolutions;
  (this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.super_TPZVec<TPZFMatrix<double>_*>
  .fStore = (this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.fExtAlloc;
  (this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.super_TPZVec<TPZFMatrix<double>_*>
  .fNElements = 0;
  (this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.super_TPZVec<TPZFMatrix<double>_*>
  .fNAlloc = 0;
  (this->fSolutions).super_TPZManVector<TPZFMatrix<double>_*,_10>.super_TPZVec<TPZFMatrix<double>_*>
  ._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_017a0958;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fStore =
       (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.fExtAlloc;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNElements = 0;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNAlloc = 0;
  (this->fSolvers).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0165a738;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fStore =
       (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.fExtAlloc;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNElements = 0;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>.fNAlloc = 0;
  (this->fPrecondition).super_TPZManVector<TPZMatrixSolver<double>_*,_10>.
  super_TPZVec<TPZMatrixSolver<double>_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0165a738;
  this->fBegin = 0;
  this->fInit = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&solver,"* * * MALHA INICIAL * * *",&local_141);
  TPZCompMesh::SetName(cmesh,(string *)&solver);
  std::__cxx11::string::~string((string *)&solver);
  TPZStack<TPZCompMesh_*,_10>::Push(&this->fMeshes,cmesh);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer(&local_140,(TPZMatrix<double> *)0x0);
  TPZStepSolver<double>::TPZStepSolver(&solver,&local_140);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_140);
  TPZStepSolver<double>::SetDirect(&solver,ELDLt);
  pTVar1 = TPZStepSolver<double>::Clone(&solver);
  object = (TPZMatrixSolver<double> *)
           __dynamic_cast(pTVar1,&TPZSolver::typeinfo,&TPZMatrixSolver<double>::typeinfo,0);
  (*(this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable[0x10])
            (this,object);
  TPZStack<TPZMatrixSolver<double>_*,_10>::Push(&this->fSolvers,object);
  this_00 = (TPZFMatrix<double> *)operator_new(0x90);
  A = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_
                (&(this->super_TPZLinearAnalysis).super_TPZAnalysis.fSolution);
  TPZFMatrix<double>::TPZFMatrix(this_00,A);
  TPZStack<TPZFMatrix<double>_*,_10>::Push(local_138,this_00);
  TPZStack<TPZMatrixSolver<double>_*,_10>::Push(&this->fPrecondition,(TPZMatrixSolver<double> *)0x0)
  ;
  TPZStepSolver<double>::~TPZStepSolver(&solver);
  return;
}

Assistant:

TPZNonLinMultGridAnalysis::TPZNonLinMultGridAnalysis(TPZCompMesh *cmesh) : 
TPZLinearAnalysis(cmesh), fBegin(0), fInit(0) {
	cmesh->SetName("* * * MALHA INICIAL * * *");
	fMeshes.Push(cmesh);
	TPZStepSolver<STATE> solver;
	solver.SetDirect(ELDLt);
	TPZMatrixSolver<STATE> *clone = dynamic_cast<TPZMatrixSolver<STATE> *>(solver.Clone());
	SetSolver(*clone);
	fSolvers.Push(clone);
	fSolutions.Push(new TPZFMatrix<STATE>(fSolution));
	fPrecondition.Push(0);
}